

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_imbue_regeneration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CClass *this;
  void *arg2;
  int iVar2;
  char *pcVar3;
  AFFECT_DATA af;
  
  bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_atrophy);
  if (bVar1) {
    act("$n\'s body stops wasting away.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("Your body stops wasting away.\n\r",(CHAR_DATA *)vo);
    iVar2 = (int)gsn_atrophy;
  }
  else {
    iVar2 = skill_lookup("prevent healing");
    bVar1 = is_affected((CHAR_DATA *)vo,iVar2);
    if (bVar1) {
      act("$n\'s sickly looking complexion clears up.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      send_to_char("You no longer feel so sick and weary.\n\r",(CHAR_DATA *)vo);
      pcVar3 = "prevent healing";
    }
    else {
      iVar2 = skill_lookup("wither");
      bVar1 = is_affected((CHAR_DATA *)vo,iVar2);
      if (!bVar1) {
        bVar1 = is_affected((CHAR_DATA *)vo,sn);
        if (bVar1) {
          if ((CHAR_DATA *)vo == ch) {
            pcVar3 = "You are already healing at an improved rate.\n\r";
          }
          else {
            pcVar3 = "They are already healing at an improved rate.\n\r";
          }
          send_to_char(pcVar3,ch);
          return;
        }
        init_affect(&af);
        af.where = 0;
        af.aftype = 4;
        af.type = (short)sn;
        af.location = 0x1d;
        af.modifier = (short)(level / 0xb);
        bVar1 = is_npc(ch);
        if (!bVar1) {
          this = char_data::Class(ch);
          iVar2 = CClass::GetIndex(this);
          if (iVar2 == 9) {
            af.modifier = af.modifier + 2;
          }
        }
        af.level = (short)level;
        af.duration = (short)(level / 5);
        af.mod_name = 0xf;
        affect_to_char((CHAR_DATA *)vo,&af);
        send_to_char("You feel your body warm with an inner health.\n\r",(CHAR_DATA *)vo);
        if ((CHAR_DATA *)vo != ch) {
          send_to_char("You boost their recuperation ability.\n\r",ch);
        }
        return;
      }
      if ((CHAR_DATA *)vo == ch) {
        send_to_char("Your emaciated body parts heal up.\n\r",ch);
        pcVar3 = "$n\'s emaciated body heals up.";
        arg2 = (void *)0x0;
      }
      else {
        act("$N\'s emaciated body heals up with your touch.",ch,(void *)0x0,vo,3);
        act("Your emaciated body heals up with $n\'s touch.",ch,(void *)0x0,vo,2);
        pcVar3 = "$N\'s emaciated body heals up with $n\'s touch.";
        arg2 = vo;
      }
      act(pcVar3,ch,(void *)0x0,arg2,(uint)((CHAR_DATA *)vo != ch));
      pcVar3 = "wither";
    }
    iVar2 = skill_lookup(pcVar3);
  }
  switchD_00333f01::default((CHAR_DATA *)vo,iVar2);
  return;
}

Assistant:

void spell_imbue_regeneration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected(victim, gsn_atrophy))
	{
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		send_to_char("Your body stops wasting away.\n\r", victim);
		affect_strip(victim, gsn_atrophy);
		return;
	}

	if (is_affected(victim, skill_lookup("prevent healing")))
	{
		act("$n's sickly looking complexion clears up.", victim, 0, 0, TO_ROOM);
		send_to_char("You no longer feel so sick and weary.\n\r", victim);
		affect_strip(victim, skill_lookup("prevent healing"));
		return;
	}

	if (is_affected(victim, skill_lookup("wither")))
	{
		if (victim != ch)
		{
			act("$N's emaciated body heals up with your touch.", ch, 0, victim, TO_CHAR);
			act("Your emaciated body heals up with $n's touch.", ch, 0, victim, TO_VICT);
			act("$N's emaciated body heals up with $n's touch.", ch, 0, victim, TO_NOTVICT);
		}
		else
		{
			send_to_char("Your emaciated body parts heal up.\n\r", ch);
			act("$n's emaciated body heals up.", ch, 0, 0, TO_ROOM);
		}

		affect_strip(victim, skill_lookup("wither"));
		return;
	}

	if (is_affected(victim, sn))
	{
		if (victim == ch)
			send_to_char("You are already healing at an improved rate.\n\r", ch);
		else
			send_to_char("They are already healing at an improved rate.\n\r", ch);

		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.type = sn;
	af.location = APPLY_REGENERATION;
	af.modifier = level / 11;

	if (!is_npc(ch) && ch->Class()->GetIndex() == CLASS_HEALER)
		af.modifier += 2;

	af.level = level;
	af.duration = level / 5;
	af.mod_name = MOD_REGEN;
	affect_to_char(victim, &af);

	send_to_char("You feel your body warm with an inner health.\n\r", victim);

	if (victim != ch)
		send_to_char("You boost their recuperation ability.\n\r", ch);
}